

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContextLimits::ReferenceContextLimits
          (ReferenceContextLimits *this,RenderContext *renderCtx)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  
  dVar5 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  (this->contextType).super_ApiType.m_bits = dVar5;
  this->maxTextureImageUnits = 0;
  this->maxTexture2DSize = 0;
  this->maxTextureCubeSize = 0;
  this->maxTexture2DArrayLayers = 0;
  this->maxTexture3DSize = 0;
  this->maxRenderbufferSize = 0;
  *(undefined8 *)&this->maxVertexAttribs = 0;
  *(undefined8 *)
   ((long)&(this->extensionList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->extensionList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(this->extensionList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->extensionStr)._M_dataplus._M_p = (pointer)&(this->extensionStr).field_2;
  (this->extensionStr)._M_string_length = 0;
  (this->extensionStr).field_2._M_local_buf[0] = '\0';
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar7 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar7 + 0x868))(0x8872,&this->maxTextureImageUnits);
  piVar1 = &this->maxTexture2DSize;
  (**(code **)(lVar7 + 0x868))(0xd33,piVar1);
  piVar2 = &this->maxTextureCubeSize;
  (**(code **)(lVar7 + 0x868))(0x851c,piVar2);
  (**(code **)(lVar7 + 0x868))(0x84e8,&this->maxRenderbufferSize);
  (**(code **)(lVar7 + 0x868))(0x8869,&this->maxVertexAttribs);
  bVar4 = glu::contextSupports((ContextType)(this->contextType).super_ApiType.m_bits,(ApiType)0x3);
  if ((bVar4) || (((this->contextType).super_ApiType.m_bits & 0x300) == 0x100)) {
    (**(code **)(lVar7 + 0x868))(0x88ff,&this->maxTexture2DArrayLayers);
    (**(code **)(lVar7 + 0x868))(0x8073);
  }
  iVar6 = *piVar1;
  if (0x3fff < iVar6) {
    iVar6 = 0x4000;
  }
  *piVar1 = iVar6;
  iVar6 = *piVar2;
  if (0x3fff < iVar6) {
    iVar6 = 0x4000;
  }
  *piVar2 = iVar6;
  iVar6 = this->maxTexture3DSize;
  iVar3 = 0x4000;
  if (iVar6 < 0x4000) {
    iVar3 = iVar6;
  }
  this->maxTexture3DSize = iVar3;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                  ,0x10b);
  addExtension(this,"GL_EXT_color_buffer_half_float");
  addExtension(this,"GL_EXT_color_buffer_float");
  bVar4 = glu::contextSupports((ContextType)(this->contextType).super_ApiType.m_bits,(ApiType)0x13);
  if (bVar4) {
    addExtension(this,"GL_EXT_texture_cube_map_array");
  }
  return;
}

Assistant:

ReferenceContextLimits::ReferenceContextLimits (const glu::RenderContext& renderCtx)
	: contextType				(renderCtx.getType())
	, maxTextureImageUnits		(0)
	, maxTexture2DSize			(0)
	, maxTextureCubeSize		(0)
	, maxTexture2DArrayLayers	(0)
	, maxTexture3DSize			(0)
	, maxRenderbufferSize		(0)
	, maxVertexAttribs			(0)
{
	const glw::Functions& gl = renderCtx.getFunctions();

	gl.getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS,		&maxTextureImageUnits);
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE,				&maxTexture2DSize);
	gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE,	&maxTextureCubeSize);
	gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE,		&maxRenderbufferSize);
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS,			&maxVertexAttribs);

	if (contextSupports(contextType, glu::ApiType::es(3,0)) || glu::isContextTypeGLCore(contextType))
	{
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS,	&maxTexture2DArrayLayers);
		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE,		&maxTexture3DSize);
	}

	// Limit texture sizes to supported values
	maxTexture2DSize	= de::min(maxTexture2DSize,		(int)MAX_TEXTURE_SIZE);
	maxTextureCubeSize	= de::min(maxTextureCubeSize,	(int)MAX_TEXTURE_SIZE);
	maxTexture3DSize	= de::min(maxTexture3DSize,		(int)MAX_TEXTURE_SIZE);

	GLU_EXPECT_NO_ERROR(gl.getError(), GL_NO_ERROR);

	// \todo [pyry] Figure out following things:
	// + supported fbo configurations
	// ...

	// \todo [2013-08-01 pyry] Do we want to make these conditional based on renderCtx?
	addExtension("GL_EXT_color_buffer_half_float");
	addExtension("GL_EXT_color_buffer_float");

	if (contextSupports(contextType, glu::ApiType::es(3,1)))
		addExtension("GL_EXT_texture_cube_map_array");
}